

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfloat16.cpp
# Opt level: O0

void qFloatToFloat16_fast(quint16 *out,float *in,qsizetype len)

{
  bool bVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  qsizetype i;
  qsizetype HalfStep;
  qsizetype Step;
  anon_class_16_2_74ab7d14 convertOneChunk_1;
  anon_class_16_2_74ab7d14 convertOneChunk;
  long local_78;
  undefined1 in_stack_ffffffffffffffb8 [16];
  anon_class_16_2_74ab7d14 local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 0;
  if (in_RDX < 8) {
    bVar1 = hasFastF16Avx256();
    if (bVar1) {
      qFloatToFloat16_tail_avx256((quint16 *)Step,(float *)HalfStep,i);
    }
    else if (in_RDX < 4) {
      for (; local_78 < in_RDX; local_78 = local_78 + 1) {
        auVar2 = vcvtps2ph_f16c(ZEXT416(*(uint *)(in_RSI + local_78 * 4)),0);
        *(short *)(in_RDI + local_78 * 2) = auVar2._0_2_;
      }
    }
    else {
      qFloatToFloat16_fast::anon_class_16_2_74ab7d14::operator()(local_28,0);
      qFloatToFloat16_fast::anon_class_16_2_74ab7d14::operator()(local_28,in_RDX + -4);
    }
  }
  else {
    while( true ) {
      if (in_RDX <= local_78 + 8) break;
      qFloatToFloat16_fast::anon_class_16_2_74ab7d14::operator()
                (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_);
      local_78 = local_78 + 8;
    }
    qFloatToFloat16_fast::anon_class_16_2_74ab7d14::operator()
              (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qFloatToFloat16_fast(quint16 *out, const float *in, qsizetype len) noexcept
{
    constexpr qsizetype Step = sizeof(__m256i) / sizeof(float);
    constexpr qsizetype HalfStep = sizeof(__m128i) / sizeof(float);
    qsizetype i = 0;

    if (len >= Step) {
        auto convertOneChunk = [=](qsizetype offset) QT_FUNCTION_TARGET(F16C) {
            __m256 f32 = _mm256_loadu_ps(in + offset);
            __m128i f16 = _mm256_cvtps_ph(f32, _MM_FROUND_TO_NEAREST_INT);
            _mm_storeu_si128(reinterpret_cast<__m128i *>(out + offset), f16);
        };

        // main loop: convert Step (8) floats per iteration
        for ( ; i + Step < len; i += Step)
            convertOneChunk(i);

        // epilogue: convert the last chunk, possibly overlapping with the last
        // iteration of the loop
        return convertOneChunk(len - Step);
    }

#if QT_COMPILER_SUPPORTS_HERE(AVX512VL) && QT_COMPILER_SUPPORTS_HERE(AVX512BW)
    if (hasFastF16Avx256())
        return qFloatToFloat16_tail_avx256(out, in, len);
#endif

    if (len >= HalfStep) {
        auto convertOneChunk = [=](qsizetype offset) QT_FUNCTION_TARGET(F16C) {
            __m128 f32 = _mm_loadu_ps(in + offset);
            __m128i f16 = _mm_cvtps_ph(f32, _MM_FROUND_TO_NEAREST_INT);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(out + offset), f16);
        };

        // two conversions, possibly overlapping
        convertOneChunk(0);
        return convertOneChunk(len - HalfStep);
    }

    // Inlining "qfloat16::qfloat16(float f)":
    for ( ; i < len; ++i)
        out[i] = _mm_extract_epi16(_mm_cvtps_ph(_mm_set_ss(in[i]), 0), 0);
}